

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bson.c
# Opt level: O2

void test_bson_build_child_array(void)

{
  char cVar1;
  bson_t *b_00;
  undefined8 uVar2;
  char *pcVar3;
  bson_t b;
  bson_t child;
  bson_t bStack_200;
  undefined1 local_180 [360];
  
  bson_init(&bStack_200);
  cVar1 = bson_append_array_begin(&bStack_200,"foo",0xffffffffffffffff,local_180);
  if (cVar1 == '\0') {
    pcVar3 = "bson_append_array_begin (&b, \"foo\", -1, &child)";
    uVar2 = 0x5a5;
  }
  else {
    cVar1 = bson_append_utf8(local_180,"0",0xffffffffffffffff,"baz",0xffffffff);
    if (cVar1 == '\0') {
      pcVar3 = "bson_append_utf8 (&child, \"0\", -1, \"baz\", -1)";
      uVar2 = 0x5a6;
    }
    else {
      cVar1 = bson_append_array_end(&bStack_200,local_180);
      if (cVar1 == '\0') {
        pcVar3 = "bson_append_array_end (&b, &child)";
        uVar2 = 0x5a7;
      }
      else {
        b_00 = (bson_t *)bson_new();
        uVar2 = bson_new();
        cVar1 = bson_append_utf8(uVar2,"0",0xffffffffffffffff,"baz",0xffffffff);
        if (cVar1 == '\0') {
          pcVar3 = "bson_append_utf8 (child2, \"0\", -1, \"baz\", -1)";
          uVar2 = 0x5ab;
        }
        else {
          cVar1 = bson_append_array(b_00,"foo",0xffffffffffffffff,uVar2);
          if (cVar1 == '\0') {
            pcVar3 = "bson_append_array (b2, \"foo\", -1, child2)";
            uVar2 = 0x5ac;
          }
          else {
            bson_destroy(uVar2);
            if (bStack_200.len == b_00->len) {
              BSON_ASSERT_BSON_EQUAL(&bStack_200,b_00);
              bson_destroy(&bStack_200);
              bson_destroy(b_00);
              return;
            }
            pcVar3 = "b.len == b2->len";
            uVar2 = 0x5af;
          }
        }
      }
    }
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-bson.c",
          uVar2,"test_bson_build_child_array",pcVar3);
  abort();
}

Assistant:

static void
test_bson_build_child_array (void)
{
   bson_t b;
   bson_t child;
   bson_t *b2;
   bson_t *child2;

   bson_init (&b);
   BSON_ASSERT (bson_append_array_begin (&b, "foo", -1, &child));
   BSON_ASSERT (bson_append_utf8 (&child, "0", -1, "baz", -1));
   BSON_ASSERT (bson_append_array_end (&b, &child));

   b2 = bson_new ();
   child2 = bson_new ();
   BSON_ASSERT (bson_append_utf8 (child2, "0", -1, "baz", -1));
   BSON_ASSERT (bson_append_array (b2, "foo", -1, child2));
   bson_destroy (child2);

   BSON_ASSERT (b.len == b2->len);
   BSON_ASSERT_BSON_EQUAL (&b, b2);

   bson_destroy (&b);
   bson_destroy (b2);
}